

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QDateTime toEarliest(QDate day,QTimeZone *zone)

{
  int iVar1;
  uint uVar2;
  QTime time;
  Data DVar3;
  Data DVar4;
  Data DVar5;
  time_t tVar6;
  Data DVar7;
  QDate QVar8;
  Data DVar9;
  QDate QVar10;
  Data DVar11;
  Data DVar12;
  QTimeZone *in_RDX;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  long in_FS_OFFSET;
  QDateTime probe_1;
  QDateTime probe;
  QDateTime when;
  QTime local_7c;
  Data local_78;
  QTime local_6c;
  QTime local_68;
  QTime local_64;
  Data local_60;
  QTime local_54;
  Data local_50;
  QDate local_48;
  Data local_40;
  QDateTimePrivate *local_38;
  
  local_38 = *(QDateTimePrivate **)(in_FS_OFFSET + 0x28);
  local_40.d = (QTimeZonePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.jd = (qint64)zone;
  QTimeZone::QTimeZone((QTimeZone *)&local_40.s,in_RDX);
  local_50.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QTime::QTime(&local_54,2,0,0,0);
  QVar10.jd = local_48.jd;
  QDateTime::QDateTime
            ((QDateTime *)&local_50.data,local_48,local_54,(QTimeZone *)&local_40.s,Reject);
  DVar3 = local_50;
  if (((ulong)local_50.d & 1) == 0) {
    DVar3._4_4_ = 0;
    DVar3._0_4_ = ((local_50.d)->m_status).
                  super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                  super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
  }
  if (((ulong)DVar3.d & 8) == 0) {
    QTime::QTime(&local_64,0xc,0,0,0);
    QVar10.jd = local_48.jd;
    QDateTime::QDateTime
              ((QDateTime *)&local_60.data,local_48,local_64,(QTimeZone *)&local_40.s,Reject);
    DVar3 = local_50;
    local_50 = local_60;
    local_60.d = DVar3.d;
    QDateTime::~QDateTime((QDateTime *)&local_60.data);
    DVar4 = local_50;
    if (((ulong)local_50.d & 1) == 0) {
      DVar4._4_4_ = 0;
      DVar4._0_4_ = ((local_50.d)->m_status).
                    super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    if (((ulong)DVar4.d & 8) != 0) goto LAB_003441ea;
    QTime::QTime(&local_68,0x17,0x3b,0x3b,999);
    QVar10.jd = local_48.jd;
    QDateTime::QDateTime
              ((QDateTime *)&local_60.data,local_48,local_68,(QTimeZone *)&local_40.s,Reject);
    DVar3 = local_50;
    local_50 = local_60;
    local_60.d = DVar3.d;
    QDateTime::~QDateTime((QDateTime *)&local_60.data);
    DVar5 = local_50;
    if (((ulong)local_50.d & 1) == 0) {
      DVar5._4_4_ = 0;
      DVar5._0_4_ = ((local_50.d)->m_status).
                    super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    if (((ulong)DVar5.d & 8) != 0) goto LAB_003441ea;
  }
  else {
LAB_003441ea:
    tVar6 = QDateTime::time((QDateTime *)&local_50.data,(time_t *)QVar10.jd);
    iVar16 = (int)tVar6 / 60000;
    uVar14 = 0;
    if (119999 < (int)tVar6) {
      iVar13 = 0;
      do {
        iVar18 = (iVar16 + iVar13) / 2;
        local_60.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QTime::QTime(&local_6c,(iVar16 + iVar13) / 0x78,iVar18 % 0x3c,0,0);
        QVar10.jd = (qint64)zone;
        QDateTime::QDateTime((QDateTime *)&local_60.data,(QDate)zone,local_6c,in_RDX,PreferBefore);
        DVar7 = local_60;
        if (((ulong)local_60.d & 1) == 0) {
          DVar7._4_4_ = 0;
          DVar7._0_4_ = ((local_60.d)->m_status).
                        super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                        super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
        }
        iVar1 = iVar18;
        if ((((ulong)DVar7.d & 8) != 0) &&
           (QVar8 = QDateTime::date((QDateTime *)&local_60.data), (QTimeZone *)QVar8.jd == zone)) {
          QVar10.jd = (qint64)&local_60;
          QDateTime::operator=((QDateTime *)&local_50.data,(QDateTime *)&local_60.data);
          iVar1 = iVar13;
          iVar16 = iVar18;
        }
        iVar13 = iVar1;
        QDateTime::~QDateTime((QDateTime *)&local_60.data);
      } while (iVar13 + 1 < iVar16);
      uVar14 = iVar13 * 0x3c;
    }
    local_60.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    tVar6 = QDateTime::time((QDateTime *)&local_50.data,(time_t *)QVar10.jd);
    time.mds = -1;
    uVar17 = (uint)tVar6;
    if (uVar17 < 86400000) {
      if (uVar17 < 1000) {
        time.mds = uVar17 + 0x5265818;
      }
      else {
        time.mds = uVar17 - 1000;
      }
    }
    QDateTime::QDateTime((QDateTime *)&local_60.data,local_48,time,(QTimeZone *)&local_40.s,Reject);
    DVar9 = local_60;
    if (((ulong)local_60.d & 1) == 0) {
      DVar9._4_4_ = 0;
      DVar9._0_4_ = ((local_60.d)->m_status).
                    super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    if (((((ulong)DVar9.d & 8) != 0) &&
        (QVar10 = QDateTime::date((QDateTime *)&local_60.data), (QTimeZone *)QVar10.jd == zone)) &&
       (uVar17 = iVar16 * 0x3c, (int)(uVar14 | 1) < (int)uVar17)) {
      do {
        iVar16 = uVar17 + uVar14;
        uVar15 = iVar16 / 2;
        local_78.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QTime::QTime(&local_7c,iVar16 / 0x1c20,(iVar16 / 0x78) % 0x3c,(int)uVar15 % 0x3c,0);
        QDateTime::QDateTime
                  ((QDateTime *)&local_78.data,local_48,local_7c,(QTimeZone *)&local_40.s,Reject);
        DVar12 = local_78;
        if (((ulong)local_78.d & 1) == 0) {
          DVar12._4_4_ = 0;
          DVar12._0_4_ = ((local_78.d)->m_status).
                         super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                         super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
        }
        uVar2 = uVar15;
        if ((((ulong)DVar12.d & 8) != 0) &&
           (QVar10 = QDateTime::date((QDateTime *)&local_78.data), (QTimeZone *)QVar10.jd == zone))
        {
          QDateTime::operator=((QDateTime *)&local_50.data,(QDateTime *)&local_78.data);
          uVar2 = uVar14;
          uVar17 = uVar15;
        }
        uVar14 = uVar2;
        QDateTime::~QDateTime((QDateTime *)&local_78.data);
      } while ((int)(uVar14 + 1) < (int)uVar17);
    }
    QDateTime::~QDateTime((QDateTime *)&local_60.data);
    DVar11 = local_50;
    if (((ulong)local_50.d & 1) == 0) {
      DVar11._4_4_ = 0;
      DVar11._0_4_ = ((local_50.d)->m_status).
                     super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
                     super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i;
    }
    if (((ulong)DVar11.d & 8) != 0) {
      QDateTime::QDateTime((QDateTime *)day.jd,(QDateTime *)&local_50.data);
      goto LAB_0034439f;
    }
  }
  QDateTime::QDateTime((QDateTime *)day.jd);
LAB_0034439f:
  QDateTime::~QDateTime((QDateTime *)&local_50.data);
  QTimeZone::~QTimeZone((QTimeZone *)&local_40.s);
  if (((Data *)(in_FS_OFFSET + 0x28))->d != local_38) {
    __stack_chk_fail();
  }
  return (QDateTime)((Data *)(in_FS_OFFSET + 0x28))->d;
}

Assistant:

static QDateTime toEarliest(QDate day, const QTimeZone &zone)
{
    Q_ASSERT(!zone.isUtcOrFixedOffset());
    // And the day starts in a gap. First find a moment not in that gap.
    const auto moment = [=](QTime time) {
        return QDateTime(day, time, zone, QDateTime::TransitionResolution::Reject);
    };
    // Longest routine time-zone transition is 2 hours:
    QDateTime when = moment(QTime(2, 0));
    if (!when.isValid()) {
        // Noon should be safe ...
        when = moment(QTime(12, 0));
        if (!when.isValid()) {
            // ... unless it's a 24-hour jump (moving the date-line)
            when = moment(QTime(23, 59, 59, 999));
            if (!when.isValid())
                return QDateTime();
        }
    }
    int high = when.time().msecsSinceStartOfDay() / 60000;
    int low = 0;
    // Binary chop to the right minute
    while (high > low + 1) {
        const int mid = (high + low) / 2;
        const QDateTime probe = QDateTime(day, QTime(mid / 60, mid % 60), zone,
                                          QDateTime::TransitionResolution::PreferBefore);
        if (probe.isValid() && probe.date() == day) {
            high = mid;
            when = probe;
        } else {
            low = mid;
        }
    }
    // Transitions out of local solar mean time, and the few international
    // date-line crossings before that (Alaska, Philippines), may have happened
    // between minute boundaries. Don't try to fix milliseconds.
    if (QDateTime p = moment(when.time().addSecs(-1)); Q_UNLIKELY(p.isValid() && p.date() == day)) {
        high *= 60;
        low *= 60;
        while (high > low + 1) {
            const int mid = (high + low) / 2;
            const int min = mid / 60;
            const QDateTime probe = moment(QTime(min / 60, min % 60, mid % 60));
            if (probe.isValid() && probe.date() == day) {
                high = mid;
                when = probe;
            } else {
                low = mid;
            }
        }
    }
    return when.isValid() ? when : QDateTime();
}